

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O2

int Amap_LibParseEquations(Amap_Lib_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vTruth;
  Vec_Ptr_t *vVarNames;
  Hop_Man_t *p_00;
  void *pvVar4;
  char *pcVar5;
  Hop_Obj_t *pRoot;
  uint *pTruth;
  char *pcVar6;
  undefined8 *puVar7;
  
  iVar1 = Amap_LibNumPinsMax(p);
  if (0xf < iVar1) {
    printf("Gates with more than %d inputs will be ignored.\n",0xf);
  }
  iVar2 = 0x10000;
  vTruth = Vec_IntAlloc(0x10000);
  vVarNames = Vec_PtrAlloc(iVar2);
  p_00 = Hop_ManStart();
  Hop_IthVar(p_00,iVar1 + -1);
  iVar1 = 0;
  do {
    if (p->vGates->nSize <= iVar1) {
LAB_0033d027:
      free(vVarNames->pArray);
      free(vVarNames);
      free(vTruth->pArray);
      free(vTruth);
      Hop_ManStop(p_00);
      return (int)(iVar1 == p->vGates->nSize);
    }
    pvVar4 = Vec_PtrEntry(p->vGates,iVar1);
    uVar3 = *(uint *)((long)pvVar4 + 0x38);
    if (uVar3 < 0x1000000) {
      pcVar5 = Aig_MmFlexEntryFetch(p->pMemGates,4);
      *(char **)((long)pvVar4 + 0x30) = pcVar5;
      pcVar6 = *(char **)((long)pvVar4 + 0x28);
      iVar2 = strcmp(pcVar6,"CONST0");
      if (iVar2 == 0) {
        pcVar5[0] = '\0';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        pcVar5[3] = '\0';
      }
      else {
        iVar2 = strcmp(pcVar6,"CONST1");
        if (iVar2 != 0) {
          printf("Cannot parse formula \"%s\" of gate \"%s\" with no pins.\n",pcVar6,
                 *(undefined8 *)((long)pvVar4 + 0x10));
          goto LAB_0033d027;
        }
        pcVar5[0] = -1;
        pcVar5[1] = -1;
        pcVar5[2] = -1;
        pcVar5[3] = -1;
      }
    }
    else if (uVar3 < 0x10000000) {
      vVarNames->nSize = 0;
      for (puVar7 = (undefined8 *)((long)pvVar4 + 0x40);
          puVar7 < (undefined8 *)((long)pvVar4 + 0x40) + (ulong)(uVar3 >> 0x18) * 9;
          puVar7 = puVar7 + 9) {
        Vec_PtrPush(vVarNames,(void *)*puVar7);
        uVar3 = *(uint *)((long)pvVar4 + 0x38);
      }
      pRoot = Amap_ParseFormula(_stdout,*(char **)((long)pvVar4 + 0x28),vVarNames,p_00,
                                *(char **)((long)pvVar4 + 0x10));
      if (pRoot == (Hop_Obj_t *)0x0) goto LAB_0033d027;
      pTruth = Hop_ManConvertAigToTruth(p_00,pRoot,(uint)*(byte *)((long)pvVar4 + 0x3b),vTruth,0);
      iVar2 = Kit_TruthSupportSize(pTruth,(uint)*(byte *)((long)pvVar4 + 0x3b));
      uVar3 = *(uint *)((long)pvVar4 + 0x38);
      if (iVar2 < (int)(uVar3 >> 0x18)) {
        if (fVerbose != 0) {
          printf("Skipping gate \"%s\" because its output \"%s\" does not depend on all input variables.\n"
                 ,*(undefined8 *)((long)pvVar4 + 0x10),*(undefined8 *)((long)pvVar4 + 0x28));
        }
      }
      else {
        iVar2 = 4 << ((char)(uVar3 >> 0x18) - 5U & 0x1f);
        if (uVar3 < 0x6000000) {
          iVar2 = 4;
        }
        pcVar6 = Aig_MmFlexEntryFetch(p->pMemGates,iVar2);
        *(char **)((long)pvVar4 + 0x30) = pcVar6;
        iVar2 = 1 << ((char)(*(uint *)((long)pvVar4 + 0x38) >> 0x18) - 5U & 0x1f);
        if (*(uint *)((long)pvVar4 + 0x38) < 0x6000000) {
          iVar2 = 1;
        }
        memcpy(pcVar6,pTruth,(long)iVar2 << 2);
      }
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

int Amap_LibParseEquations( Amap_Lib_t * p, int fVerbose )
{
//    extern int Kit_TruthSupportSize( unsigned * pTruth, int nVars );
    Hop_Man_t * pMan;
    Hop_Obj_t * pObj;
    Vec_Ptr_t * vNames;
    Vec_Int_t * vTruth;
    Amap_Gat_t * pGate;
    Amap_Pin_t * pPin;
    unsigned * pTruth;
    int i, nPinMax;
    nPinMax = Amap_LibNumPinsMax(p);
    if ( nPinMax > AMAP_MAXINS )
        printf( "Gates with more than %d inputs will be ignored.\n", AMAP_MAXINS );
    vTruth = Vec_IntAlloc( 1 << 16 );
    vNames = Vec_PtrAlloc( 100 );
    pMan = Hop_ManStart();
    Hop_IthVar( pMan, nPinMax - 1 );
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vGates, pGate, i )
    {
        if ( pGate->nPins == 0 )
        {
            pGate->pFunc = (unsigned *)Aig_MmFlexEntryFetch( p->pMemGates, 4 );
            if ( strcmp( pGate->pForm, AMAP_STRING_CONST0 ) == 0 )
                pGate->pFunc[0] = 0;
            else if ( strcmp( pGate->pForm, AMAP_STRING_CONST1 ) == 0 )
                pGate->pFunc[0] = ~0;
            else
            {
                printf( "Cannot parse formula \"%s\" of gate \"%s\" with no pins.\n", pGate->pForm, pGate->pName );
                break;
            }
            continue;
        }
        if ( pGate->nPins > AMAP_MAXINS )
            continue;
        Vec_PtrClear( vNames );
        Amap_GateForEachPin( pGate, pPin )
            Vec_PtrPush( vNames, pPin->pName );
        pObj = Amap_ParseFormula( stdout, pGate->pForm, vNames, pMan, pGate->pName );
        if ( pObj == NULL )
            break;
        pTruth = Hop_ManConvertAigToTruth( pMan, pObj, pGate->nPins, vTruth, 0 );
        if ( Kit_TruthSupportSize(pTruth, pGate->nPins) < (int)pGate->nPins )
        {
            if ( fVerbose )
                printf( "Skipping gate \"%s\" because its output \"%s\" does not depend on all input variables.\n", pGate->pName, pGate->pForm );
            continue;
        }
        pGate->pFunc = (unsigned *)Aig_MmFlexEntryFetch( p->pMemGates, sizeof(unsigned)*Abc_TruthWordNum(pGate->nPins) );
        memcpy( pGate->pFunc, pTruth, sizeof(unsigned)*Abc_TruthWordNum(pGate->nPins) );
    }
    Vec_PtrFree( vNames );
    Vec_IntFree( vTruth );
    Hop_ManStop( pMan );
    return i == Vec_PtrSize(p->vGates);
}